

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O3

void __thiscall
timertt::details::
timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::utilize_exec_list(timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
                    *this,timer_type *head)

{
  reference_counter_type *prVar1;
  long *plVar2;
  timer_type *ptVar3;
  long lVar4;
  
  if (head != (timer_type *)0x0) {
    do {
      ptVar3 = head->m_next;
      lVar4 = (head->m_period).__r;
      if (*(int *)&(head->super_timer_object<timertt::thread_safety::unsafe>).field_0xc == 2) {
        if (lVar4 == 0) {
          lVar4 = 0x40;
          goto LAB_001ee925;
        }
        (head->m_when).__d.__r = (head->m_when).__d.__r + lVar4;
        *(undefined4 *)&(head->super_timer_object<timertt::thread_safety::unsafe>).field_0xc = 1;
        insert_timer_to_list(this,head);
      }
      else {
        lVar4 = (ulong)(lVar4 != 0) * 8 + 0x40;
LAB_001ee925:
        plVar2 = (long *)((long)&(this->
                                 super_engine_common<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
                                 ).m_error_logger.super__Function_base._M_functor + lVar4);
        *plVar2 = *plVar2 + -1;
        *(undefined4 *)&(head->super_timer_object<timertt::thread_safety::unsafe>).field_0xc = 0;
        prVar1 = &(head->super_timer_object<timertt::thread_safety::unsafe>).m_references;
        *prVar1 = *prVar1 - 1;
        if (*prVar1 == 0) {
          (*(head->super_timer_object<timertt::thread_safety::unsafe>)._vptr_timer_object[1])(head);
        }
      }
      head = ptVar3;
    } while (ptVar3 != (timer_type *)0x0);
  }
  return;
}

Assistant:

void
	utilize_exec_list(
		//! Head of execution list.
		//! Cannot be null.
		timer_type * head )
	{
		while( head )
		{
			auto t = head;
			head = head->m_next;

			// Actual periodic timer must be rescheduled.
			if( timer_status::wait_for_execution == t->m_status &&
					monotonic_clock::duration::zero() != t->m_period )
			{
				t->m_when += t->m_period;
				t->m_status = timer_status::active;

				insert_timer_to_list( t );
			}
			else
			{
				// Timer must be utilized.
				this->dec_timer_count( t->kind() );
				t->m_status = timer_status::deactivated;
				timer_object< THREAD_SAFETY >::decrement_references( t );
			}
		}
	}